

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall Raytracer::Scene::start(Scene *this,Image *img)

{
  pointer ppSVar1;
  int iVar2;
  int y;
  Shape **i;
  pointer ppSVar3;
  int x;
  ulong uVar4;
  Vec3f VVar6;
  RGB color;
  Vec3f usless;
  vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_> *__range3;
  undefined1 local_74 [24];
  float local_5c;
  float local_58;
  int local_54;
  Vec3f *local_50;
  undefined8 local_48;
  undefined4 local_40;
  Vec3f local_3c;
  undefined8 extraout_XMM0_Qa;
  float fVar5;
  
  if (0 < img->height) {
    local_50 = &(this->camera).origin;
    y = 0;
    local_74._12_8_ = this;
    do {
      if (0 < img->width) {
        x = 0;
        do {
          local_5c = (float)x;
          local_54 = -0x40800000;
          local_58 = (float)y;
          VVar6 = Camera::WorldToCamera((Camera *)local_74,local_50,(Image *)&local_5c);
          local_48 = 0;
          local_40 = 0;
          local_3c.z = (float)local_74._8_4_;
          local_3c.x = (float)local_74._0_4_;
          local_3c.y = (float)local_74._4_4_;
          ppSVar1 = (((vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_> *)
                     local_74._12_8_)->
                    super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppSVar3 = (((vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_> *)
                          local_74._12_8_)->
                         super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>
                         )._M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar1;
              ppSVar3 = ppSVar3 + 1) {
            local_74._0_4_ = 0.0;
            local_74._4_4_ = 0.0;
            local_74._8_4_ = 0.0;
            iVar2 = (*(*ppSVar3)->_vptr_Shape[2])(VVar6._0_8_,*ppSVar3,&local_48,(Camera *)local_74)
            ;
            uVar4 = 0x437f0000;
            if ((char)iVar2 == '\0') {
              uVar4 = 0;
            }
            color.b = 0.0;
            color.r = (float)(int)uVar4;
            color.g = (float)(int)(uVar4 >> 0x20);
            fVar5 = 0.0;
            Image::Update(img,y,x,color);
            VVar6.z = fVar5;
            VVar6.x = (float)(int)extraout_XMM0_Qa;
            VVar6.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
          }
          x = x + 1;
        } while (x < img->width);
      }
      y = y + 1;
    } while (y < img->height);
  }
  return;
}

Assistant:

void Raytracer::Scene::start(Raytracer::Image & img) {
    for(int y = 0;y<img.height;y++){
        for(int x = 0;x<img.width;x++) {

            Raytracer::Ray ray(Vec3f(0,0,0),camera.WorldToCamera(Vec3f(x,y,-1),img));
            for(auto &i : objects){
                Vec3f usless;
                if(i->isRayIntersect(ray,usless)){
                    img.Update(y,x,RGB(255, 0, 0));
                }else{
                    img.Update(y,x,RGB(0, 0, 0));
                }
            }
        }
    }
}